

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  bigint *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int local_50;
  
  uVar3 = lhs1->exp_;
  iVar14 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + uVar3;
  uVar4 = lhs2->exp_;
  iVar15 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar4;
  iVar17 = iVar15;
  if (iVar15 < iVar14) {
    iVar17 = iVar14;
  }
  iVar16 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar5 = rhs->exp_;
  iVar1 = iVar5 + iVar16;
  iVar8 = -1;
  if ((iVar1 <= iVar17 + 1) && (iVar8 = 1, iVar17 <= iVar1)) {
    pbVar9 = lhs1;
    if ((int)uVar4 < (int)uVar3) {
      pbVar9 = lhs2;
    }
    iVar17 = pbVar9->exp_;
    if (iVar5 < iVar17) {
      iVar17 = rhs->exp_;
    }
    uVar18 = 0;
    do {
      iVar2 = iVar5 + iVar16;
      uVar13 = uVar18;
      if (iVar2 <= iVar17) break;
      if (iVar14 < iVar2 || iVar2 <= (int)uVar3) {
        uVar10 = 0;
      }
      else {
        uVar7 = ~uVar3 + iVar5 + iVar16;
        if ((int)uVar7 < 0) goto LAB_003a5ace;
        uVar10 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar7];
      }
      if (iVar15 < iVar2 || iVar2 <= (int)uVar4) {
        uVar11 = 0;
      }
      else {
        uVar7 = ~uVar4 + iVar5 + iVar16;
        if ((int)uVar7 < 0) goto LAB_003a5ace;
        uVar11 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[uVar7];
      }
      if (iVar1 < iVar2 || iVar2 <= iVar5) {
        uVar12 = 0;
      }
      else {
        if ((int)(iVar16 - 1U) < 0) {
LAB_003a5ace:
          assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        uVar12 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[iVar16 - 1U];
      }
      uVar13 = (uVar12 + uVar18) - (uVar11 + uVar10);
      if (uVar12 + uVar18 < uVar11 + uVar10) {
        local_50 = 1;
        bVar6 = false;
        uVar13 = uVar18;
      }
      else {
        bVar6 = uVar13 < 2;
        if (bVar6) {
          uVar13 = uVar13 << 0x20;
        }
        else {
          local_50 = -1;
        }
      }
      iVar16 = iVar16 + -1;
      uVar18 = uVar13;
    } while (bVar6);
    iVar8 = -(uint)(uVar13 != 0);
    if (iVar17 < iVar2) {
      iVar8 = local_50;
    }
  }
  return iVar8;
}

Assistant:

int num_bigits() const { return static_cast<int>(bigits_.size()) + exp_; }